

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  bool bVar1;
  bool bVar2;
  xmlChar *val;
  xmlXPathObjectPtr pxVar3;
  byte *pbVar4;
  byte *pbVar5;
  int code;
  ulong uVar6;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 0) {
    val = xmlNodeGetContent(ctxt->context->node);
    if (val == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
    }
    pxVar3 = xmlXPathCacheWrapString(ctxt,val);
    xmlXPathValuePush(ctxt,pxVar3);
    nargs = 1;
  }
  if (nargs == 1) {
    if (ctxt->valueNr < 1) {
      code = 0x17;
    }
    else {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      pxVar3 = ctxt->value;
      if ((pxVar3 != (xmlXPathObjectPtr)0x0) && (pxVar3->type == XPATH_STRING)) {
        pbVar4 = pxVar3->stringval;
        pbVar5 = pbVar4;
        if (pbVar4 == (byte *)0x0) {
          return;
        }
        while (((ulong)*pbVar5 < 0x21 && ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))) {
          pbVar5 = pbVar5 + 1;
        }
        bVar1 = false;
        do {
          uVar6 = (ulong)*pbVar5;
          if (uVar6 < 0x21) {
            bVar2 = true;
            if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
              if (uVar6 == 0) {
                *pbVar4 = 0;
                return;
              }
              goto LAB_001c2acb;
            }
          }
          else {
LAB_001c2acb:
            if (bVar1) {
              *pbVar4 = 0x20;
              pbVar4 = pbVar4 + 1;
            }
            *pbVar4 = *pbVar5;
            pbVar4 = pbVar4 + 1;
            bVar2 = false;
          }
          bVar1 = bVar2;
          pbVar5 = pbVar5 + 1;
        } while( true );
      }
      code = 0xb;
    }
  }
  else {
    code = 0xc;
  }
  xmlXPathErr(ctxt,code);
  return;
}

Assistant:

void
xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlChar *source, *target;
    int blank;

    if (ctxt == NULL) return;
    if (nargs == 0) {
        /* Use current context node */
        source = xmlXPathCastNodeToString(ctxt->context->node);
        if (source == NULL)
            xmlXPathPErrMemory(ctxt);
        xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, source));
        nargs = 1;
    }

    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    source = ctxt->value->stringval;
    if (source == NULL)
        return;
    target = source;

    /* Skip leading whitespaces */
    while (IS_BLANK_CH(*source))
        source++;

    /* Collapse intermediate whitespaces, and skip trailing whitespaces */
    blank = 0;
    while (*source) {
        if (IS_BLANK_CH(*source)) {
	    blank = 1;
        } else {
            if (blank) {
                *target++ = 0x20;
                blank = 0;
            }
            *target++ = *source;
        }
        source++;
    }
    *target = 0;
}